

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

bool __thiscall BamTools::ConvertTool::ConvertToolPrivate::Run(ConvertToolPrivate *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  __type _Var4;
  _Ios_Openmode _Var5;
  char *pcVar6;
  ostream *poVar7;
  istream *piVar8;
  long *in_RDI;
  BadDataException *e;
  BamAlignment a;
  offset_in_ConvertToolPrivate_to_subr pFunction;
  bool formatError;
  bool convertedOk;
  ofstream outFile;
  BamRegion region;
  BamMultiReader reader;
  string line;
  ifstream filelist;
  BamAlignment *in_stack_fffffffffffff8c8;
  BamAlignment *in_stack_fffffffffffff8d0;
  value_type *in_stack_fffffffffffff8d8;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffff8e0;
  code *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  BamAlignment *in_stack_fffffffffffff910;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffff968;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffff970;
  undefined1 local_620 [120];
  BamRegion *in_stack_fffffffffffffa58;
  BamMultiReader *in_stack_fffffffffffffa60;
  ConvertToolPrivate *in_stack_fffffffffffffa68;
  string local_4c8 [32];
  code *local_4a8;
  long local_4a0;
  byte local_492;
  byte local_491;
  long local_490 [64];
  int local_290 [4];
  BamRegion local_280 [2];
  undefined4 local_254;
  string local_248 [32];
  int local_228;
  istream local_218 [535];
  byte local_1;
  
  if (((*(byte *)*in_RDI & 1) == 0) && ((*(byte *)(*in_RDI + 1) & 1) == 0)) {
    Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  }
  if ((*(byte *)(*in_RDI + 1) & 1) != 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_218,pcVar6,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "bamtools convert ERROR: could not open input BAM file list... Aborting."
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_228 = 1;
    }
    else {
      std::__cxx11::string::string(local_248);
      while( true ) {
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248)
        ;
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        if (!bVar3) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      }
      std::__cxx11::string::~string(local_248);
      local_228 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_228 != 0) goto LAB_0011a281;
  }
  BamMultiReader::BamMultiReader((BamMultiReader *)in_stack_fffffffffffff8e0);
  bVar3 = BamMultiReader::Open
                    ((BamMultiReader *)in_stack_fffffffffffff8d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff8c8);
  if (bVar3) {
    if (((*(byte *)*in_RDI & 1) != 0) && ((*(byte *)(*in_RDI + 4) & 1) != 0)) {
      local_254 = 1;
      bVar3 = BamMultiReader::LocateIndexes
                        ((BamMultiReader *)in_stack_fffffffffffff8d0,
                         (IndexType *)in_stack_fffffffffffff8c8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: could not locate index file(s)... Aborting."
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_228 = 1;
        goto LAB_0011a263;
      }
    }
    BamMultiReader::GetReferenceData((BamMultiReader *)in_stack_fffffffffffff8c8);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              (in_stack_fffffffffffff8e0);
    local_290[3] = 0xffffffff;
    local_290[2] = 0xffffffff;
    local_290[1] = 0xffffffff;
    local_290[0] = -1;
    BamRegion::BamRegion(local_280,local_290 + 3,local_290 + 2,local_290 + 1,local_290);
    if ((*(byte *)(*in_RDI + 4) & 1) == 0) {
LAB_00119bae:
      std::ofstream::ofstream(local_490);
      if ((*(byte *)(*in_RDI + 2) & 1) == 0) {
LAB_00119d0c:
        local_491 = 1;
        _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        if (_Var4) {
          local_491 = RunPileupConversion(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
        }
        else {
          local_492 = 0;
          local_4a0 = 0;
          local_4a8 = (code *)0x0;
          _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
          if (_Var4) {
            local_4a8 = PrintBed;
            local_4a0 = 0;
          }
          else {
            _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
            if (_Var4) {
              local_4a8 = PrintFasta;
              local_4a0 = 0;
            }
            else {
              _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
              if (_Var4) {
                local_4a8 = PrintFastq;
                local_4a0 = 0;
              }
              else {
                _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
                if (_Var4) {
                  local_4a8 = PrintJson;
                  local_4a0 = 0;
                }
                else {
                  _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
                  if (_Var4) {
                    local_4a8 = PrintSam;
                    local_4a0 = 0;
                  }
                  else {
                    _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
                    if (_Var4) {
                      local_4a8 = PrintYaml;
                      local_4a0 = 0;
                    }
                    else {
                      poVar7 = std::operator<<((ostream *)&std::cerr,
                                               "bamtools convert ERROR: unrecognized format: ");
                      in_stack_fffffffffffff910 =
                           (BamAlignment *)std::operator<<(poVar7,(string *)(*in_RDI + 0x60));
                      std::ostream::operator<<
                                (in_stack_fffffffffffff910,std::endl<char,std::char_traits<char>>);
                      poVar7 = std::operator<<((ostream *)&std::cerr,
                                               "Please see documentation for list of supported formats "
                                              );
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                      local_492 = 1;
                      local_491 = 0;
                    }
                  }
                }
              }
            }
          }
          if ((local_492 & 1) == 0) {
            _Var4 = std::operator==(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
            if ((_Var4) && ((*(byte *)(*in_RDI + 6) & 1) == 0)) {
              BamMultiReader::GetHeaderText_abi_cxx11_((BamMultiReader *)in_stack_fffffffffffff8c8);
              std::operator<<((ostream *)(in_RDI + 4),local_4c8);
              std::__cxx11::string::~string(local_4c8);
            }
            BamAlignment::BamAlignment(in_stack_fffffffffffff910);
            while (bVar3 = BamMultiReader::GetNextAlignment
                                     ((BamMultiReader *)in_stack_fffffffffffff8d0,
                                      in_stack_fffffffffffff8c8), bVar3) {
              pcVar9 = local_4a8;
              if (((ulong)local_4a8 & 1) != 0) {
                pcVar9 = *(code **)(local_4a8 + *(long *)((long)in_RDI + local_4a0) + -1);
              }
              (*pcVar9)((long *)((long)in_RDI + local_4a0),local_620);
            }
            local_491 = 1;
            BamAlignment::~BamAlignment(in_stack_fffffffffffff8d0);
          }
        }
        BamMultiReader::Close((BamMultiReader *)0x11a206);
        if ((*(byte *)(*in_RDI + 2) & 1) != 0) {
          std::ofstream::close();
        }
        local_1 = local_491 & 1;
      }
      else {
        _Var5 = std::__cxx11::string::c_str();
        std::ofstream::open((char *)local_490,_Var5);
        bVar2 = std::ios::operator!((ios *)((long)local_490 + *(long *)(local_490[0] + -0x18)));
        if ((bVar2 & 1) == 0) {
          lVar1 = *(long *)(in_RDI[4] + -0x18);
          std::ofstream::rdbuf();
          std::ios::rdbuf((streambuf *)((long)in_RDI + lVar1 + 0x20));
          goto LAB_00119d0c;
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,"bamtools convert ERROR: could not open ");
        poVar7 = std::operator<<(poVar7,(string *)(*in_RDI + 0x40));
        poVar7 = std::operator<<(poVar7," for output");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      local_228 = 1;
      std::ofstream::~ofstream(local_490);
    }
    else {
      bVar3 = Utilities::ParseRegionString
                        ((string *)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                         in_stack_fffffffffffffa58);
      if (bVar3) {
        bVar3 = BamMultiReader::HasIndexes((BamMultiReader *)0x119a2a);
        if ((!bVar3) ||
           (bVar3 = BamMultiReader::SetRegion
                              ((BamMultiReader *)in_stack_fffffffffffff8d0,
                               (BamRegion *)in_stack_fffffffffffff8c8), bVar3)) goto LAB_00119bae;
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: set region failed. Check that REGION describes a valid range"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        BamMultiReader::Close((BamMultiReader *)0x119ab2);
        local_1 = 0;
        local_228 = 1;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools convert ERROR: could not parse REGION: ");
        poVar7 = std::operator<<(poVar7,(string *)(*in_RDI + 0x80));
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        BamMultiReader::Close((BamMultiReader *)0x119b92);
        local_1 = 0;
        local_228 = 1;
      }
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                            );
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_228 = 1;
  }
LAB_0011a263:
  BamMultiReader::~BamMultiReader((BamMultiReader *)in_stack_fffffffffffff8d0);
LAB_0011a281:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertTool::ConvertToolPrivate::Run()
{

    // ------------------------------------
    // initialize conversion input/output

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools convert ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // open input files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // if input is not stdin & a region is provided, look for index files
    if (m_settings->HasInput && m_settings->HasRegion) {
        if (!reader.LocateIndexes()) {
            std::cerr << "bamtools convert ERROR: could not locate index file(s)... Aborting."
                      << std::endl;
            return false;
        }
    }

    // retrieve reference data
    m_references = reader.GetReferenceData();

    // set region if specified
    BamRegion region;
    if (m_settings->HasRegion) {
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            if (reader.HasIndexes()) {
                if (!reader.SetRegion(region)) {
                    std::cerr << "bamtools convert ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }
            }

        } else {
            std::cerr << "bamtools convert ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // if output file given
    std::ofstream outFile;
    if (m_settings->HasOutput) {

        // open output file stream
        outFile.open(m_settings->OutputFilename.c_str());
        if (!outFile) {
            std::cerr << "bamtools convert ERROR: could not open " << m_settings->OutputFilename
                      << " for output" << std::endl;
            return false;
        }

        // set m_out to file's streambuf
        m_out.rdbuf(outFile.rdbuf());
    }

    // -------------------------------------
    // do conversion based on format

    bool convertedOk = true;

    // pileup is special case
    // conversion not done per alignment, like the other formats
    if (m_settings->Format == FORMAT_PILEUP) {
        convertedOk = RunPileupConversion(&reader);

        // all other formats
    } else {

        bool formatError = false;

        // set function pointer to proper conversion method
        void (BamTools::ConvertTool::ConvertToolPrivate::*pFunction)(const BamAlignment&) = 0;
        if (m_settings->Format == FORMAT_BED) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintBed;
        } else if (m_settings->Format == FORMAT_FASTA) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFasta;
        } else if (m_settings->Format == FORMAT_FASTQ) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFastq;
        } else if (m_settings->Format == FORMAT_JSON) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintJson;
        } else if (m_settings->Format == FORMAT_SAM) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintSam;
        } else if (m_settings->Format == FORMAT_YAML) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintYaml;
        } else {
            std::cerr << "bamtools convert ERROR: unrecognized format: " << m_settings->Format
                      << std::endl;
            std::cerr << "Please see documentation for list of supported formats " << std::endl;
            formatError = true;
            convertedOk = false;
        }

        // if format selected ok
        if (!formatError) {

            // if SAM format & not omitting header, print SAM header first
            if ((m_settings->Format == FORMAT_SAM) && !m_settings->IsOmittingSamHeader) {
                m_out << reader.GetHeaderText();
            }

            try {
                // iterate through file, doing conversion
                BamAlignment a;
                while (reader.GetNextAlignment(a)) {
                    (this->*pFunction)(a);
                }

                // set flag for successful conversion
                convertedOk = true;
            } catch (const BadDataException& e) {
                std::cerr << "Conversion failed : " << e.what() << '\n';

                convertedOk = false;
            }
        }
    }

    // ------------------------
    // clean up & exit
    reader.Close();
    if (m_settings->HasOutput) {
        outFile.close();
    }
    return convertedOk;
}